

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

uint128 * __thiscall
pstore::sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128>::
bitmap<unsigned_long_const*,void>
          (uint128 *__return_storage_ptr__,
          sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *this,
          unsigned_long *first,unsigned_long *last)

{
  uint128 *puVar1;
  unsigned_long *extraout_RDX;
  ulong uVar2;
  uint128 *puVar3;
  uint128 local_38;
  
  puVar3 = (uint128 *)0x0;
  uVar2 = 0;
  while( true ) {
    if ((sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *)__return_storage_ptr__
        == this) {
      return puVar3;
    }
    if ((uint128 *)0x7f < *(uint128 **)__return_storage_ptr__) break;
    local_38.v_._8_8_ = 0;
    local_38.v_._0_8_ = 1;
    puVar1 = uint128::operator<<(&local_38,*(uint128 **)__return_storage_ptr__,(unsigned_long)first)
    ;
    if (((ulong)puVar1 & (ulong)puVar3) != 0 || ((ulong)extraout_RDX & uVar2) != 0) {
      assert_failed("(mm & mask) == 0U && \"The same index must not appear more than once in the \" \"collection of sparse indices\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                    ,0x25d);
    }
    uVar2 = uVar2 | (ulong)extraout_RDX;
    puVar3 = (uint128 *)((ulong)puVar3 | (ulong)puVar1);
    __return_storage_ptr__ = (uint128 *)((long)__return_storage_ptr__ + 8);
    first = extraout_RDX;
  }
  assert_failed("idx < max_size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x259);
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }